

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

uint32_t direct_get(aec_stream_conflict *strm,int n)

{
  internal_state_conflict *piVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  piVar1 = strm->state;
  iVar2 = piVar1->bitp;
  if (n <= iVar2) goto LAB_00104607;
  iVar3 = (int)(0x3fU - iVar2) >> 3;
  switch(iVar3) {
  case 1:
    uVar5 = piVar1->acc << 8;
    pbVar4 = strm->next_in;
    uVar6 = (ulong)*pbVar4;
    break;
  case 2:
    pbVar4 = strm->next_in;
    uVar6 = (ulong)*pbVar4 << 8 | piVar1->acc << 0x10;
    uVar5 = (ulong)pbVar4[1];
    goto LAB_0010458e;
  case 3:
    pbVar4 = strm->next_in;
    uVar5 = (ulong)pbVar4[1] << 8 | (ulong)*pbVar4 << 0x10 | piVar1->acc << 0x18;
    uVar6 = (ulong)pbVar4[2];
    break;
  case 4:
    pbVar4 = strm->next_in;
    uVar6 = (ulong)pbVar4[2] << 8 |
            (ulong)pbVar4[1] << 0x10 | (ulong)*pbVar4 << 0x18 | piVar1->acc << 0x20;
    uVar5 = (ulong)pbVar4[3];
    goto LAB_0010458e;
  case 5:
    pbVar4 = strm->next_in;
    uVar5 = (ulong)pbVar4[3] << 8 |
            (ulong)pbVar4[2] << 0x10 |
            (ulong)pbVar4[1] << 0x18 | (ulong)*pbVar4 << 0x20 | piVar1->acc << 0x28;
    uVar6 = (ulong)pbVar4[4];
    break;
  case 6:
    pbVar4 = strm->next_in;
    uVar6 = (ulong)pbVar4[4] << 8 |
            (ulong)pbVar4[3] << 0x10 |
            (ulong)pbVar4[2] << 0x18 |
            (ulong)pbVar4[1] << 0x20 | (ulong)*pbVar4 << 0x28 | piVar1->acc << 0x30;
    uVar5 = (ulong)pbVar4[5];
LAB_0010458e:
    piVar1->acc = uVar5 | uVar6;
    goto LAB_001045f5;
  case 7:
    pbVar4 = strm->next_in;
    uVar5 = (ulong)pbVar4[5] << 8 |
            (ulong)pbVar4[4] << 0x10 |
            (ulong)pbVar4[3] << 0x18 |
            (ulong)pbVar4[2] << 0x20 |
            (ulong)pbVar4[1] << 0x28 | (ulong)*pbVar4 << 0x30 | piVar1->acc << 0x38;
    uVar6 = (ulong)pbVar4[6];
    break;
  default:
    pbVar4 = strm->next_in;
    goto LAB_001045f5;
  }
  piVar1->acc = uVar6 | uVar5;
LAB_001045f5:
  strm->next_in = pbVar4 + iVar3;
  strm->avail_in = strm->avail_in - (long)iVar3;
  iVar2 = iVar2 + (0x3fU - iVar2 & 0xfffffff8);
LAB_00104607:
  piVar1->bitp = iVar2 - n;
  return (uint)(piVar1->acc >> ((byte)(iVar2 - n) & 0x3f)) &
         (uint)(0xffffffffffffffff >> (-(char)n & 0x3fU));
}

Assistant:

static inline uint32_t direct_get(struct aec_stream *strm, int n)
{
    /**
       Get n bit from input stream

       No checking whatsoever. Read bits are dumped.
     */

    struct internal_state *state = strm->state;
    if (state->bitp < n)
    {
        int b = (63 - state->bitp) >> 3;
        if (b == 6) {
            state->acc = (state->acc << 48)
                | ((uint64_t)strm->next_in[0] << 40)
                | ((uint64_t)strm->next_in[1] << 32)
                | ((uint64_t)strm->next_in[2] << 24)
                | ((uint64_t)strm->next_in[3] << 16)
                | ((uint64_t)strm->next_in[4] << 8)
                | (uint64_t)strm->next_in[5];
        } else if (b == 7) {
            state->acc = (state->acc << 56)
                | ((uint64_t)strm->next_in[0] << 48)
                | ((uint64_t)strm->next_in[1] << 40)
                | ((uint64_t)strm->next_in[2] << 32)
                | ((uint64_t)strm->next_in[3] << 24)
                | ((uint64_t)strm->next_in[4] << 16)
                | ((uint64_t)strm->next_in[5] << 8)
                | (uint64_t)strm->next_in[6];
        } else if (b == 5) {
            state->acc = (state->acc << 40)
                | ((uint64_t)strm->next_in[0] << 32)
                | ((uint64_t)strm->next_in[1] << 24)
                | ((uint64_t)strm->next_in[2] << 16)
                | ((uint64_t)strm->next_in[3] << 8)
                | (uint64_t)strm->next_in[4];
        } else if (b == 4) {
            state->acc = (state->acc << 32)
                | ((uint64_t)strm->next_in[0] << 24)
                | ((uint64_t)strm->next_in[1] << 16)
                | ((uint64_t)strm->next_in[2] << 8)
                | (uint64_t)strm->next_in[3];
        } else if (b == 3) {
            state->acc = (state->acc << 24)
                | ((uint64_t)strm->next_in[0] << 16)
                | ((uint64_t)strm->next_in[1] << 8)
                | (uint64_t)strm->next_in[2];
        } else if (b == 2) {
            state->acc = (state->acc << 16)
                | ((uint64_t)strm->next_in[0] << 8)
                | (uint64_t)strm->next_in[1];
        } else if (b == 1) {
            state->acc = (state->acc << 8)
                | (uint64_t)strm->next_in[0];
        }
        strm->next_in += b;
        strm->avail_in -= b;
        state->bitp += b << 3;
    }

    state->bitp -= n;
    return (state->acc >> state->bitp) & (UINT64_MAX >> (64 - n));
}